

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O2

void __thiscall
jaegertracing::Tracer::Tracer
          (Tracer *this,string *serviceName,shared_ptr<jaegertracing::samplers::Sampler> *sampler,
          shared_ptr<jaegertracing::reporters::Reporter> *reporter,
          shared_ptr<jaegertracing::logging::Logger> *logger,
          shared_ptr<jaegertracing::metrics::Metrics> *metrics,HeadersConfig *headersConfig,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *tags,int options)

{
  IPAddress *__return_storage_ptr__;
  shared_ptr<jaegertracing::metrics::Metrics> *this_00;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *__result;
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  uint uVar4;
  RestrictionManager *pRVar5;
  string *this_01;
  allocator local_1419 [9];
  string local_1410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f0;
  HTTPHeaderPropagator *local_13d0;
  TextMapPropagator *local_13c8;
  string *local_13c0;
  random_device device;
  
  (this->super_enable_shared_from_this<jaegertracing::Tracer>)._M_weak_this.
  super___weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<jaegertracing::Tracer>)._M_weak_this.
  super___weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Tracer)._vptr_Tracer = (_func_int **)&PTR__Tracer_00297a20;
  local_13c0 = &this->_serviceName;
  std::__cxx11::string::string((string *)local_13c0,(string *)serviceName);
  __return_storage_ptr__ = &this->_hostIPv4;
  net::IPAddress::localIP(__return_storage_ptr__,2);
  std::__shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_sampler).
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>,
             &sampler->
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_reporter).
              super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>,
             &reporter->
              super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = &this->_metrics;
  std::__shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&this_00->
              super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>,
             &metrics->
              super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_logger).
              super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>,
             &logger->super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>
            );
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(&this->_randomNumberGenerator);
  *(undefined8 *)((long)&(this->_randomMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_randomMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_randomMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_randomMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->_randomMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_13c8 = &this->_textPropagator;
  propagation::
  Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
  Propagator(local_13c8,headersConfig,this_00);
  local_13d0 = &this->_httpHeaderPropagator;
  propagation::HTTPHeaderPropagator::Propagator(local_13d0,headersConfig,this_00);
  propagation::BinaryPropagator::BinaryPropagator(&this->_binaryPropagator,this_00);
  __result = &this->_tags;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_tags).super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar5 = (RestrictionManager *)operator_new(0x10);
  pRVar5->_vptr_RestrictionManager = (_func_int **)&PTR__RestrictionManager_00297f90;
  *(undefined1 *)&pRVar5[1]._vptr_RestrictionManager = 1;
  *(undefined4 *)((long)&pRVar5[1]._vptr_RestrictionManager + 4) = 0x800;
  (this->_restrictionManager)._M_t.
  super___uniq_ptr_impl<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::baggage::RestrictionManager_*,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  .super__Head_base<0UL,_jaegertracing::baggage::RestrictionManager_*,_false>._M_head_impl = pRVar5;
  peVar1 = (this->_metrics).
           super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->_baggageSetter)._restrictionManager = pRVar5;
  (this->_baggageSetter)._metrics = peVar1;
  this->_options = options;
  std::__cxx11::string::string((string *)&local_1410,"jaeger.version",(allocator *)&local_13f0);
  Tag::Tag<char_const*const&>((Tag *)&device,&local_1410,&kJaegerClientVersion);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
  emplace_back<jaegertracing::Tag>(__result,(Tag *)&device);
  Tag::~Tag((Tag *)&device);
  std::__cxx11::string::~string((string *)&local_1410);
  std::__cxx11::string::string((string *)&local_1410,"hostname",local_1419);
  platform::hostname_abi_cxx11_();
  Tag::Tag<std::__cxx11::string>((Tag *)&device,&local_1410,&local_13f0);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
  emplace_back<jaegertracing::Tag>(__result,(Tag *)&device);
  Tag::~Tag((Tag *)&device);
  std::__cxx11::string::~string((string *)&local_13f0);
  std::__cxx11::string::~string((string *)&local_1410);
  device.field_0._128_4_ = 0x10;
  device.field_0.field_0._M_file = (void *)0x0;
  device.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  device.field_0._16_8_ = 0;
  device.field_0._24_8_ = 0;
  device.field_0._32_8_ = 0;
  device.field_0._40_8_ = 0;
  device.field_0._48_8_ = 0;
  device.field_0._56_8_ = 0;
  device.field_0._64_8_ = 0;
  device.field_0._72_8_ = 0;
  device.field_0._80_8_ = 0;
  device.field_0._88_8_ = 0;
  device.field_0._96_8_ = 0;
  device.field_0._104_8_ = 0;
  device.field_0._112_8_ = 0;
  device.field_0._120_8_ = 0;
  bVar3 = net::IPAddress::operator==(__return_storage_ptr__,(IPAddress *)&device);
  if (bVar3) {
    peVar2 = (this->_logger).
             super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string
              ((string *)&device,"Unable to determine this host\'s IP address",
               (allocator *)&local_1410);
    (*peVar2->_vptr_Logger[2])(peVar2,&device);
    this_01 = (string *)&device;
  }
  else {
    std::__cxx11::string::string((string *)&local_1410,"ip",local_1419);
    net::IPAddress::host_abi_cxx11_(&local_13f0,__return_storage_ptr__);
    Tag::Tag<std::__cxx11::string>((Tag *)&device,&local_1410,&local_13f0);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
    emplace_back<jaegertracing::Tag>(__result,(Tag *)&device);
    Tag::~Tag((Tag *)&device);
    std::__cxx11::string::~string((string *)&local_13f0);
    this_01 = &local_1410;
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<jaegertracing::Tag_const*,std::back_insert_iterator<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
            ((tags->super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (tags->super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>).
             _M_impl.super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
              )__result);
  std::random_device::random_device(&device);
  uVar4 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&this->_randomNumberGenerator,(ulong)uVar4);
  std::random_device::~random_device(&device);
  return;
}

Assistant:

Tracer(const std::string& serviceName,
           const std::shared_ptr<samplers::Sampler>& sampler,
           const std::shared_ptr<reporters::Reporter>& reporter,
           const std::shared_ptr<logging::Logger>& logger,
           const std::shared_ptr<metrics::Metrics>& metrics,
           const propagation::HeadersConfig& headersConfig,
           const std::vector<Tag>& tags,
           int options)
        : _serviceName(serviceName)
        , _hostIPv4(net::IPAddress::localIP(AF_INET))
        , _sampler(sampler)
        , _reporter(reporter)
        , _metrics(metrics)
        , _logger(logger)
        , _randomNumberGenerator()
        , _textPropagator(headersConfig, _metrics)
        , _httpHeaderPropagator(headersConfig, _metrics)
        , _binaryPropagator(_metrics)
        , _tags()
        , _restrictionManager(new baggage::DefaultRestrictionManager(0))
        , _baggageSetter(*_restrictionManager, *_metrics)
        , _options(options)
    {
        _tags.push_back(Tag(kJaegerClientVersionTagKey, kJaegerClientVersion));

        try {
            _tags.push_back(Tag(kTracerHostnameTagKey, platform::hostname()));
        } catch (const std::system_error&) {
            // Ignore hostname error.
        }

        if (_hostIPv4 == net::IPAddress()) {
            _logger->error("Unable to determine this host's IP address");
        }
        else {
            _tags.push_back(Tag(kTracerIPTagKey, _hostIPv4.host()));
        }

        std::copy(tags.cbegin(), tags.cend(), std::back_inserter(_tags));

        std::random_device device;
        _randomNumberGenerator.seed(device());
    }